

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O2

Regexp * __thiscall re2::Regexp::Simplify(Regexp *this)

{
  Regexp *re;
  Regexp *pRVar1;
  SimplifyWalker sw;
  CoalesceWalker cw;
  Walker<re2::Regexp_*> local_40;
  Walker<re2::Regexp_*> local_28;
  
  CoalesceWalker::CoalesceWalker((CoalesceWalker *)&local_28);
  re = Walker<re2::Regexp_*>::Walk(&local_28,this,(Regexp *)0x0);
  if (re == (Regexp *)0x0) {
    pRVar1 = (Regexp *)0x0;
  }
  else {
    SimplifyWalker::SimplifyWalker((SimplifyWalker *)&local_40);
    pRVar1 = Walker<re2::Regexp_*>::Walk(&local_40,re,(Regexp *)0x0);
    Decref(re);
    Walker<re2::Regexp_*>::~Walker(&local_40);
  }
  Walker<re2::Regexp_*>::~Walker(&local_28);
  return pRVar1;
}

Assistant:

Regexp* Regexp::Simplify() {
  CoalesceWalker cw;
  Regexp* cre = cw.Walk(this, NULL);
  if (cre == NULL)
    return cre;
  SimplifyWalker sw;
  Regexp* sre = sw.Walk(cre, NULL);
  cre->Decref();
  return sre;
}